

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random-sysctl-linux.c
# Opt level: O3

int uv__random_sysctl(void *buf,size_t buflen)

{
  long lVar1;
  int *piVar2;
  void *pvVar3;
  char *p;
  size_t __n;
  size_t n;
  char uuid [16];
  uv__sysctl_args args;
  size_t local_a0;
  undefined1 local_98 [6];
  undefined1 local_92;
  undefined1 local_90;
  undefined1 local_8a;
  undefined1 local_89;
  int *local_80;
  undefined8 local_78;
  undefined1 *puStack_70;
  size_t *local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  if ((long)buflen < 1) {
    return 0;
  }
  pvVar3 = (void *)(buflen + (long)buf);
  while( true ) {
    local_48 = 0;
    uStack_40 = 0;
    local_58 = 0;
    uStack_50 = 0;
    uStack_60 = 0;
    local_38 = 0;
    local_80 = uv__random_sysctl::name;
    local_78 = 3;
    local_68 = &local_a0;
    local_a0 = 0x10;
    puStack_70 = local_98;
    lVar1 = syscall(0x9c,&local_80);
    if (lVar1 == -1) {
      piVar2 = __errno_location();
      return -*piVar2;
    }
    if (local_a0 != 0x10) break;
    local_92 = local_8a;
    local_90 = local_89;
    __n = (long)pvVar3 - (long)buf;
    if (0xd < __n) {
      __n = 0xe;
    }
    local_a0 = __n;
    memcpy(buf,local_98,__n);
    buf = (void *)((long)buf + __n);
    if (pvVar3 <= buf) {
      return 0;
    }
  }
  return -5;
}

Assistant:

int uv__random_sysctl(void* buf, size_t buflen) {
  static int name[] = {1 /*CTL_KERN*/, 40 /*KERN_RANDOM*/, 6 /*RANDOM_UUID*/};
  struct uv__sysctl_args args;
  char uuid[16];
  char* p;
  char* pe;
  size_t n;

  p = buf;
  pe = p + buflen;

  while (p < pe) {
    memset(&args, 0, sizeof(args));

    args.name = name;
    args.nlen = ARRAY_SIZE(name);
    args.oldval = uuid;
    args.oldlenp = &n;
    n = sizeof(uuid);

    /* Emits a deprecation warning with some kernels but that seems like
     * an okay trade-off for the fallback of the fallback: this function is
     * only called when neither getrandom(2) nor /dev/urandom are available.
     * Fails with ENOSYS on kernels configured without CONFIG_SYSCTL_SYSCALL.
     * At least arm64 never had a _sysctl system call and therefore doesn't
     * have a SYS__sysctl define either.
     */
#ifdef SYS__sysctl
    if (syscall(SYS__sysctl, &args) == -1)
      return UV__ERR(errno);
#else
    {
      (void) &args;
      return UV_ENOSYS;
    }
#endif

    if (n != sizeof(uuid))
      return UV_EIO;  /* Can't happen. */

    /* uuid[] is now a type 4 UUID. Bytes 6 and 8 (counting from zero) contain
     * 4 and 5 bits of entropy, respectively. For ease of use, we skip those
     * and only use 14 of the 16 bytes.
     */
    uuid[6] = uuid[14];
    uuid[8] = uuid[15];

    n = pe - p;
    if (n > 14)
      n = 14;

    memcpy(p, uuid, n);
    p += n;
  }

  return 0;
}